

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

PaddingResult __thiscall QTextStreamPrivate::padding(QTextStreamPrivate *this,qsizetype len)

{
  PaddingResult PVar1;
  long lVar2;
  qsizetype padSize;
  qsizetype right;
  qsizetype left;
  qsizetype len_local;
  QTextStreamPrivate *this_local;
  
  left = 0;
  right = 0;
  lVar2 = (this->params).fieldWidth - len;
  switch((this->params).fieldAlignment) {
  case AlignLeft:
    right = lVar2;
    break;
  case AlignRight:
  case AlignAccountingStyle:
    left = lVar2;
    break;
  case AlignCenter:
    left = lVar2 / 2;
    right = lVar2 - lVar2 / 2;
  }
  PVar1.right = right;
  PVar1.left = left;
  return PVar1;
}

Assistant:

QTextStreamPrivate::PaddingResult QTextStreamPrivate::padding(qsizetype len) const
{
    Q_ASSERT(params.fieldWidth > len); // calling padding() when no padding is needed is an error

    qsizetype left = 0, right = 0;

    const qsizetype padSize = params.fieldWidth - len;

    switch (params.fieldAlignment) {
    case QTextStream::AlignLeft:
        right = padSize;
        break;
    case QTextStream::AlignRight:
    case QTextStream::AlignAccountingStyle:
        left  = padSize;
        break;
    case QTextStream::AlignCenter:
        left  = padSize/2;
        right = padSize - padSize/2;
        break;
    }
    return { left, right };
}